

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *this)

{
  BinaryReader<mp::internal::IdentityConverter> bound_reader;
  VarBoundHandler<TestNLHandler2> bound_handler;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  reader;
  undefined1 auStack_88 [64];
  VarBoundHandler<TestNLHandler2> local_48;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  local_38;
  
  if ((this->flags_ & 1) == 0) {
    Read(this,(BinaryReader<mp::internal::IdentityConverter> *)0x0);
    return;
  }
  local_48.handler_ = this->handler_;
  local_48.super_NullNLHandler<TestNLHandler2::TestExpr>.
  super_NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>.
  _vptr_NLHandler =
       (NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>)
       &PTR__NLHandler_002b41e0;
  ReaderBase::ReaderBase((ReaderBase *)auStack_88,(ReaderBase *)this->reader_);
  local_38.header_ = this->header_;
  local_38.flags_ = this->flags_;
  local_38.num_vars_and_exprs_ = 0;
  local_38.reader_ = (BinaryReader<mp::internal::IdentityConverter> *)auStack_88;
  local_38.handler_ = &local_48;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  ::Read(&local_38,(BinaryReader<mp::internal::IdentityConverter> *)0x0);
  Read(this,(BinaryReader<mp::internal::IdentityConverter> *)auStack_88);
  std::__cxx11::string::~string((string *)(auStack_88 + 0x20));
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}